

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_directory_traversals.c
# Opt level: O0

void test_symlink_logical_loop(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t v1;
  int iVar5;
  int local_34;
  la_int64_t lStack_30;
  int file_count;
  int64_t offset;
  size_t size;
  void *p;
  archive_entry *ae;
  archive *a;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                   ,L'ό');
    test_skipping("Can\'t test symlinks on this filesystem");
  }
  else {
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ϓ',"l2",L'ǭ');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                    ,L'ϔ',"l2");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ϕ',"d1",L'ǭ');
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ϖ',"d1/d2",L'ǭ');
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'ϗ',"d1/d2/d3",L'ǭ');
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                       ,L'Ϙ',"d2",L'ǭ');
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ϙ',"d2/file1",L'Ƥ',L'\xffffffff',"d2/file1");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'Ϛ',"d1/d2/ld1","../../d1",L'\x01');
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
               ,L'ϛ',"d1/d2/ld2","../../d2",L'\x01');
    assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                    ,L'Ϝ',"..");
    p = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'Ϟ',(uint)((archive_entry *)p != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    ae = (archive_entry *)archive_read_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                     ,L'ϟ',(uint)(ae != (archive_entry *)0x0),
                     "(a = archive_read_disk_new()) != NULL",(void *)0x0);
    wVar1 = archive_read_disk_set_symlink_logical((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'ϡ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_set_symlink_logical(a)"
                        ,ae);
    wVar1 = archive_read_disk_open((archive *)ae,"l2/d1");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'Ϧ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_open(a, \"l2/d1\")",ae)
    ;
    local_34 = 6;
    while (iVar5 = local_34 + -1, local_34 != 0) {
      iVar2 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                          ,L'Ϫ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header2(a, ae)",ae);
      pcVar4 = archive_entry_pathname((archive_entry *)p);
      iVar2 = strcmp(pcVar4,"l2/d1");
      if (iVar2 == 0) {
        mVar3 = archive_entry_filetype((archive_entry *)p);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'Ϭ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                            (void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)p);
        iVar2 = strcmp(pcVar4,"l2/d1/d2");
        if (iVar2 == 0) {
          mVar3 = archive_entry_filetype((archive_entry *)p);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                              ,L'Ϯ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                              (void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)p);
          iVar2 = strcmp(pcVar4,"l2/d1/d2/d3");
          if (iVar2 == 0) {
            mVar3 = archive_entry_filetype((archive_entry *)p);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                ,L'ϰ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,"AE_IFDIR",
                                (void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)p);
            iVar2 = strcmp(pcVar4,"l2/d1/d2/ld1");
            if (iVar2 == 0) {
              mVar3 = archive_entry_filetype((archive_entry *)p);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                  ,L'ϲ',(ulong)mVar3,"archive_entry_filetype(ae)",0xa000,"AE_IFLNK"
                                  ,(void *)0x0);
            }
            else {
              pcVar4 = archive_entry_pathname((archive_entry *)p);
              iVar2 = strcmp(pcVar4,"l2/d1/d2/ld2");
              if (iVar2 == 0) {
                mVar3 = archive_entry_filetype((archive_entry *)p);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                    ,L'ϴ',(ulong)mVar3,"archive_entry_filetype(ae)",0x4000,
                                    "AE_IFDIR",(void *)0x0);
              }
              else {
                pcVar4 = archive_entry_pathname((archive_entry *)p);
                iVar2 = strcmp(pcVar4,"l2/d1/d2/ld2/file1");
                if (iVar2 == 0) {
                  mVar3 = archive_entry_filetype((archive_entry *)p);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'Ϸ',(ulong)mVar3,"archive_entry_filetype(ae)",0x8000,
                                      "AE_IFREG",(void *)0x0);
                  v1 = archive_entry_size((archive_entry *)p);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'ϸ',v1,"archive_entry_size(ae)",8,"8",(void *)0x0);
                  iVar2 = archive_read_data_block
                                    ((archive *)ae,(void **)&size,(size_t *)&offset,
                                     &stack0xffffffffffffffd0);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'Ϻ',0,"ARCHIVE_OK",(long)iVar2,
                                      "archive_read_data_block(a, &p, &size, &offset)",ae);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'ϻ',(long)(int)offset,"(int)size",8,"8",(void *)0x0);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'ϼ',(long)(int)lStack_30,"(int)offset",0,"0",(void *)0x0);
                  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'Ͻ',(void *)size,"p","d2/file1","\"d2/file1\"",8,"8",
                                      (void *)0x0);
                  iVar2 = archive_read_data_block
                                    ((archive *)ae,(void **)&size,(size_t *)&offset,
                                     &stack0xffffffffffffffd0);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'Ͽ',1,"ARCHIVE_EOF",(long)iVar2,
                                      "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'Ѐ',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                                      ,L'Ё',(long)(int)lStack_30,"(int)offset",8,"8",(void *)0x0);
                }
              }
            }
          }
        }
      }
      mVar3 = archive_entry_filetype((archive_entry *)p);
      local_34 = iVar5;
      if (mVar3 == 0x4000) {
        wVar1 = archive_read_disk_descend((archive *)ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                            ,L'І',0,"ARCHIVE_OK",(long)wVar1,"archive_read_disk_descend(a)",ae);
      }
    }
    iVar5 = archive_read_next_header2((archive *)ae,(archive_entry *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'Њ',1,"ARCHIVE_EOF",(long)iVar5,"archive_read_next_header2(a, ae)",ae);
    iVar5 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_disk_directory_traversals.c"
                        ,L'Ќ',0,"ARCHIVE_OK",(long)iVar5,"archive_read_free(a)",(void *)0x0);
    archive_entry_free((archive_entry *)p);
  }
  return;
}

Assistant:

static void
test_symlink_logical_loop(void)
{
	struct archive *a;
	struct archive_entry *ae;
	const void *p;
	size_t size;
	int64_t offset;
	int file_count;

	if (!canSymlink()) {
		skipping("Can't test symlinks on this filesystem");
		return;
	}

	/*
	 * Create a sample archive.
	 */
	assertMakeDir("l2", 0755);
	assertChdir("l2");
	assertMakeDir("d1", 0755);
	assertMakeDir("d1/d2", 0755);
	assertMakeDir("d1/d2/d3", 0755);
	assertMakeDir("d2", 0755);
	assertMakeFile("d2/file1", 0644, "d2/file1");
	assertMakeSymlink("d1/d2/ld1", "../../d1", 1);
	assertMakeSymlink("d1/d2/ld2", "../../d2", 1);
	assertChdir("..");

	assert((ae = archive_entry_new()) != NULL);
	assert((a = archive_read_disk_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_set_symlink_logical(a));

	/*
	 * Specified file is a symbolic link file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "l2/d1"));
	file_count = 6;

	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae), "l2/d1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "l2/d1/d2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "l2/d1/d2/d3") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae), "l2/d1/d2/ld1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFLNK);
		} else if (strcmp(archive_entry_pathname(ae), "l2/d1/d2/ld2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
		} else if (strcmp(archive_entry_pathname(ae),
		    "l2/d1/d2/ld2/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 8);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 8);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "d2/file1", 8);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 8);
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));
	/* Destroy the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	archive_entry_free(ae);
}